

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O2

void __thiscall GEO::geofile::rotate_Z(geofile *this,double *theta,point *in_point)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = sin(*theta);
  dVar3 = cos(*theta);
  dVar1 = in_point->x;
  in_point->x = dVar3 * dVar1 + -in_point->y * dVar2;
  in_point->y = dVar3 * in_point->y + dVar1 * dVar2;
  return;
}

Assistant:

void GEO::geofile::rotate_Z(const double &theta, point &in_point)
{
    double sin_theta = std::sin(theta);
    double cos_theta = std::cos(theta);
    double x = in_point.x * cos_theta - in_point.y * sin_theta;
    double y = in_point.y * cos_theta + in_point.x * sin_theta;
    in_point.x = x;
    in_point.y = y;
}